

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper-a64.c
# Opt level: O0

uint64_t helper_paired_cmpxchg64_be_parallel_aarch64
                   (CPUARMState_conflict *env,uint64_t addr,uint64_t new_lo,uint64_t new_hi)

{
  undefined1 cmpv_00 [16];
  undefined1 a [16];
  undefined1 newv_00 [16];
  undefined1 b [16];
  _Bool _Var1;
  uint idx;
  TCGMemOpIdx TVar2;
  Int128 *addr_00;
  Int128 *retaddr;
  uint64_t hi;
  uint64_t hi_00;
  undefined8 unaff_retaddr;
  undefined4 in_stack_ffffffffffffff0c;
  undefined8 in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  TCGMemOpIdx oi;
  int mem_idx;
  _Bool success;
  uintptr_t ra;
  Int128 newv;
  Int128 cmpv;
  Int128 oldv;
  uint64_t new_hi_local;
  uint64_t new_lo_local;
  uint64_t addr_local;
  CPUARMState_conflict *env_local;
  
  idx = cpu_mmu_index(env,false);
  TVar2 = make_memop_idx(MO_ALIGN_16|MO_BEQ,idx);
  addr_00 = int128_make128((Int128 *)env->exclusive_high,env->exclusive_val,hi);
  retaddr = int128_make128((Int128 *)new_hi,new_lo,hi_00);
  cmpv_00._4_4_ = in_stack_ffffffffffffff0c;
  cmpv_00._0_4_ = TVar2;
  cmpv_00._8_8_ = unaff_retaddr;
  newv_00._8_8_ = in_stack_ffffffffffffff20;
  newv_00._0_8_ = in_stack_ffffffffffffff18;
  helper_atomic_cmpxchgo_be_mmu_aarch64
            ((Int128 *)env,(CPUArchState_conflict1 *)addr,(target_ulong)addr_00,(Int128)cmpv_00,
             (Int128)newv_00,(TCGMemOpIdx)hi_00,(uintptr_t)retaddr);
  a._4_4_ = in_stack_ffffffffffffff0c;
  a._0_4_ = TVar2;
  a._8_8_ = unaff_retaddr;
  b._8_8_ = hi_00;
  b._0_8_ = addr_00;
  _Var1 = int128_eq((Int128)a,(Int128)b);
  return (long)(int)(uint)((_Var1 ^ 0xffU) & 1);
}

Assistant:

uint64_t HELPER(paired_cmpxchg64_be_parallel)(CPUARMState *env, uint64_t addr,
                                              uint64_t new_lo, uint64_t new_hi)
{
    Int128 oldv, cmpv, newv;
    uintptr_t ra = GETPC();
    bool success;
    int mem_idx;
    TCGMemOpIdx oi;

    assert(HAVE_CMPXCHG128);

    mem_idx = cpu_mmu_index(env, false);
    oi = make_memop_idx(MO_BEQ | MO_ALIGN_16, mem_idx);

    /*
     * High and low need to be switched here because this is not actually a
     * 128bit store but two doublewords stored consecutively
     */
    cmpv = int128_make128(env->exclusive_high, env->exclusive_val);
    newv = int128_make128(new_hi, new_lo);
    oldv = helper_atomic_cmpxchgo_be_mmu(env, addr, cmpv, newv, oi, ra);

    success = int128_eq(oldv, cmpv);
    return !success;
}